

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall font2svg::glyph::outline_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  vector<short,_std::allocator<short>_> *in_R8;
  vector<short,_std::allocator<short>_> contoursv;
  vector<char,_std::allocator<char>_> tagsv;
  vector<FT_Vector_,_std::allocator<FT_Vector_>_> pointsv;
  allocator_type local_a1;
  _Vector_base<short,_std::allocator<short>_> local_a0;
  _Vector_base<char,_std::allocator<char>_> local_88;
  _Vector_base<short,_std::allocator<short>_> local_70;
  _Vector_base<char,_std::allocator<char>_> local_58;
  _Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_> local_40;
  _Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_> local_28;
  
  std::vector<FT_Vector_,std::allocator<FT_Vector_>>::vector<FT_Vector_*,void>
            ((vector<FT_Vector_,std::allocator<FT_Vector_>> *)&local_28,this->ftpoints,
             this->ftpoints + (this->ftoutline).n_points,(allocator_type *)&local_88);
  std::vector<char,std::allocator<char>>::vector<char*,void>
            ((vector<char,std::allocator<char>> *)&local_88,this->tags,
             this->tags + (this->ftoutline).n_points,(allocator_type *)&local_a0);
  std::vector<short,std::allocator<short>>::vector<short*,void>
            ((vector<short,std::allocator<short>> *)&local_a0,this->contours,
             this->contours + (this->ftoutline).n_contours,&local_a1);
  std::vector<FT_Vector_,_std::allocator<FT_Vector_>_>::vector
            ((vector<FT_Vector_,_std::allocator<FT_Vector_>_> *)&local_40,
             (vector<FT_Vector_,_std::allocator<FT_Vector_>_> *)&local_28);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_58,
             (vector<char,_std::allocator<char>_> *)&local_88);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_70,
             (vector<short,_std::allocator<short>_> *)&local_a0);
  do_outline_abi_cxx11_
            (__return_storage_ptr__,(font2svg *)&local_40,
             (vector<FT_Vector_,_std::allocator<FT_Vector_>_> *)&local_58,
             (vector<char,_std::allocator<char>_> *)&local_70,in_R8);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_70);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_58);
  std::_Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>::~_Vector_base(&local_40);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_a0);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_88);
  std::_Vector_base<FT_Vector_,_std::allocator<FT_Vector_>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string outline()  {
		std::vector<FT_Vector> pointsv(ftpoints,ftpoints+ftoutline.n_points);
		std::vector<char> tagsv(tags,tags+ftoutline.n_points);
		std::vector<short> contoursv(contours,contours+ftoutline.n_contours);
		return do_outline(pointsv, tagsv, contoursv);
	}